

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O2

void k053260_write(void *chip,UINT8 offset,UINT8 data)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  uint *puVar7;
  undefined1 uVar8;
  KDSC_Voice *voice;
  
  uVar2 = offset & 0x3f;
  if (0x1f < (byte)((char)uVar2 - 8U)) {
    switch(uVar2) {
    case 0x28:
      bVar1 = *(byte *)((long)chip + 0xc);
      puVar7 = (uint *)((long)chip + 0x18);
      lVar3 = 0;
      do {
        if (lVar3 == 4) {
          *(UINT8 *)((long)chip + 0xc) = data;
          return;
        }
        bVar6 = (byte)lVar3 & 0x1f;
        if (((~bVar1 & data) >> ((uint)lVar3 & 0x1f) & 1) == 0) {
          if ((1 << bVar6 & (uint)data) == 0) {
            *puVar7 = 0;
            uVar8 = (undefined1)(0 << bVar6);
            goto LAB_0015c154;
          }
        }
        else {
          *puVar7 = (uint)(*(char *)((long)puVar7 + 0x17) != '\0');
          *(undefined2 *)(puVar7 + 2) = 0xffff;
          uVar8 = 1;
LAB_0015c154:
          *(undefined1 *)((long)puVar7 + 10) = 0;
          *(undefined1 *)((long)puVar7 + 0xb) = uVar8;
        }
        lVar3 = lVar3 + 1;
        puVar7 = puVar7 + 10;
      } while( true );
    case 0x29:
    case 0x2b:
    case 0x2e:
      return;
    case 0x2a:
      for (lVar3 = 0x2f; lVar3 != 0xcf; lVar3 = lVar3 + 0x28) {
        *(byte *)((long)chip + lVar3 + -1) = data & 1;
        *(byte *)((long)chip + lVar3) = data & 0x10;
        data = data >> 1;
      }
      return;
    case 0x2c:
      KDSC_set_pan((KDSC_Voice *)((long)chip + 0x10),data);
      voice = (KDSC_Voice *)((long)chip + 0x38);
      break;
    case 0x2d:
      KDSC_set_pan((KDSC_Voice *)((long)chip + 0x60),data);
      voice = (KDSC_Voice *)((long)chip + 0x88);
      break;
    case 0x2f:
      *(UINT8 *)((long)chip + 0xd) = data;
      return;
    default:
      if (1 < uVar2 - 2) {
        return;
      }
      *(UINT8 *)((long)chip + (ulong)uVar2 + 8) = data;
      return;
    }
    KDSC_set_pan(voice,data >> 3);
    return;
  }
  uVar2 = uVar2 - 8 >> 3;
  switch(offset & 7) {
  case 0:
    *(ushort *)((long)chip + (ulong)uVar2 * 0x28 + 0x2a) =
         (ushort)data | *(ushort *)((long)chip + (ulong)uVar2 * 0x28 + 0x2a) & 0xf00;
    break;
  case 1:
    *(byte *)((long)chip + (ulong)uVar2 * 0x28 + 0x2b) = data & 0xf;
    break;
  case 2:
    *(UINT8 *)((long)chip + (ulong)uVar2 * 0x28 + 0x28) = data;
    break;
  case 3:
    *(UINT8 *)((long)chip + (ulong)uVar2 * 0x28 + 0x29) = data;
    break;
  case 4:
    uVar4 = *(uint *)((long)chip + (ulong)uVar2 * 0x28 + 0x24) & 0x1fff00;
    uVar5 = (uint)data;
    goto LAB_0015c24c;
  case 5:
    uVar4 = *(uint *)((long)chip + (ulong)uVar2 * 0x28 + 0x24) & 0x1f00ff;
    uVar5 = (uint)data << 8;
LAB_0015c24c:
    *(uint *)((long)chip + (ulong)uVar2 * 0x28 + 0x24) = uVar5 | uVar4;
    break;
  case 6:
    *(ushort *)((long)chip + (ulong)uVar2 * 0x28 + 0x26) = data & 0x1f;
    break;
  case 7:
    bVar6 = data & 0x7f;
    *(byte *)((long)chip + (ulong)uVar2 * 0x28 + 0x2c) = bVar6;
    bVar1 = *(byte *)((long)chip + (ulong)uVar2 * 0x28 + 0x2d);
    *(ushort *)((long)chip + (ulong)uVar2 * 0x28 + 0x1c) = (8 - (ushort)bVar1) * (ushort)bVar6;
    *(ushort *)((long)chip + (ulong)uVar2 * 0x28 + 0x1e) = (ushort)bVar1 * (ushort)bVar6;
  }
  return;
}

Assistant:

static void k053260_write(void* chip, UINT8 offset, UINT8 data)
{
	k053260_state *info = (k053260_state *)chip;
	int i;

	offset &= 0x3f;

	// per voice registers
	if ((offset >= 0x08) && (offset <= 0x27))
	{
		KDSC_set_register(&info->voice[(offset - 8) / 8], offset, data);
		return;
	}

	switch (offset)
	{
		// 0x00 and 0x01 are read registers

		case 0x02: // sub-to-main ports
		case 0x03:
			info->portdata[offset] = data;
			break;

		// 0x04 through 0x07 seem to be unused

		case 0x28: // key on/off
		{
			UINT8 rising_edge = data & ~info->keyon;

			for (i = 0; i < 4; i++)
			{
				if (rising_edge & (1 << i))
					KDSC_key_on(&info->voice[i]);
				else if (!(data & (1 << i)))
					KDSC_key_off(&info->voice[i]);
			}
			info->keyon = data;
			break;
		}

		// 0x29 is a read register

		case 0x2a: // loop and pcm/adpcm select
			for (i = 0; i < 4; i++)
			{
				KDSC_set_loop_kadpcm(&info->voice[i], data);
				data >>= 1;
			}
			break;

		// 0x2b seems to be unused

		case 0x2c: // pan, voices 0 and 1
			KDSC_set_pan(&info->voice[0], data);
			KDSC_set_pan(&info->voice[1], data >> 3);
			break;

		case 0x2d: // pan, voices 2 and 3
			KDSC_set_pan(&info->voice[2], data);
			KDSC_set_pan(&info->voice[3], data >> 3);
			break;

		// 0x2e is a read register

		case 0x2f: // control
			info->mode = data;
			// bit 0 = enable ROM read from register 0x2e
			// bit 1 = enable sound output
			// bit 2 = enable aux input?
			//   (set by all games except Golfing Greats and Rollergames, both of which
			//    don't have a YM2151. Over Drive only sets it on one of the two chips)
			// bit 3 = aux input or ROM sharing related?
			//   (only set by Over Drive, and only on the same chip that bit 2 is set on)
			break;

		default:
			logerror("Write to unknown K053260 register %02x (data = %02x)\n",
					offset, data);
	}
}